

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

string * spvDecodeLiteralStringOperand_abi_cxx11_
                   (string *__return_storage_ptr__,spv_parsed_instruction_t *inst,
                   uint16_t operand_index)

{
  bool in_R8B;
  spv_parsed_operand_t *operand;
  uint16_t operand_index_local;
  spv_parsed_instruction_t *inst_local;
  
  if (operand_index < inst->num_operands) {
    spvtools::utils::MakeString_abi_cxx11_
              (__return_storage_ptr__,
               (utils *)(inst->words + (int)(uint)inst->operands[operand_index].offset),
               (uint32_t *)(ulong)inst->operands[operand_index].num_words,1,in_R8B);
    return __return_storage_ptr__;
  }
  __assert_fail("operand_index < inst.num_operands",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                ,0x44,
                "std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t &, const uint16_t)"
               );
}

Assistant:

std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t& inst,
                                          const uint16_t operand_index) {
  assert(operand_index < inst.num_operands);
  const spv_parsed_operand_t& operand = inst.operands[operand_index];

  return spvtools::utils::MakeString(inst.words + operand.offset,
                                     operand.num_words);
}